

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_unvoiced_vowel.c
# Opt level: O1

void get_mora_information
               (NJDNode *node,int index,char **mora,NJDNode **nlink,int *flag,int *size,int *midx,
               int *atype)

{
  long lVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  long lVar4;
  long lVar5;
  char cVar6;
  char cVar7;
  char *pcVar8;
  
  while( true ) {
    __s = NJDNode_get_pron(node);
    sVar3 = strlen(__s);
    if (index < (int)sVar3) break;
    node = node->next;
    index = index - (int)sVar3;
    if (node == (_NJDNode *)0x0) {
      *mora = (char *)0x0;
      *nlink = (NJDNode *)0x0;
      *flag = -1;
      *size = 0;
      *midx = 0;
      *atype = 0;
      return;
    }
  }
  *nlink = node;
  if ((index == 0) && (iVar2 = NJDNode_get_chain_flag(node), iVar2 != 1)) {
    *midx = 0;
    iVar2 = NJDNode_get_acc(node);
    *atype = iVar2;
  }
  pcVar8 = anon_var_dwarf_12ed96;
  iVar2 = strcmp(__s,anon_var_dwarf_12ed96);
  if (iVar2 != 0) {
    pcVar8 = anon_var_dwarf_9b0 + 0x12;
    iVar2 = strcmp(__s,anon_var_dwarf_9b0 + 0x12);
    if (iVar2 != 0) {
      *mora = (char *)0x0;
      *flag = -1;
      *size = 0;
      lVar4 = 0;
      do {
        pcVar8 = njd_set_unvoiced_vowel_mora_list[lVar4];
        cVar6 = *pcVar8;
        lVar5 = 0;
        if (cVar6 != '\0') {
          lVar5 = 0;
          do {
            if (__s[lVar5 + index] != cVar6) {
              lVar5 = 0xffffffff;
              break;
            }
            cVar6 = pcVar8[lVar5 + 1];
            lVar5 = lVar5 + 1;
          } while (cVar6 != '\0');
        }
        if (0 < (int)lVar5) {
          *mora = pcVar8;
          *size = (int)lVar5;
          break;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x9f);
      lVar4 = 0;
      cVar6 = -0x1e;
      do {
        cVar7 = cVar6;
        lVar5 = lVar4 + (long)*size + (long)index;
        if (__s[lVar5] != cVar7) {
          iVar2 = -1;
          goto LAB_00172d29;
        }
        lVar1 = lVar4 + 1;
        lVar4 = lVar4 + 1;
        cVar6 = anon_var_dwarf_12e3ec[lVar1];
      } while (lVar4 != 3);
      iVar2 = 3;
LAB_00172d29:
      if (__s[lVar5] == cVar7) {
        *flag = 1;
        *size = *size + iVar2;
      }
      return;
    }
  }
  *mora = pcVar8;
  *flag = 0;
  *size = 3;
  return;
}

Assistant:

static void get_mora_information(NJDNode * node, int index, const char **mora, NJDNode ** nlink,
                                 int *flag, int *size, int *midx, int *atype)
{
   int i;
   int matched_size;
   const char *str = NJDNode_get_pron(node);
   int len = strlen(str);

   /* find next word */
   if (index >= len) {
      if (node->next != NULL) {
         get_mora_information(node->next, index - len, mora, nlink, flag, size, midx, atype);
      } else {
         *mora = NULL;
         *nlink = NULL;
         *flag = -1;
         *size = 0;
         *midx = 0;
         *atype = 0;
      }
      return;
   }

   *nlink = node;

   /* reset mora index and accent type for new word */
   if (index == 0 && NJDNode_get_chain_flag(node) != 1) {
      *midx = 0;
      *atype = NJDNode_get_acc(node);
   }

   /* special symbol */
   if (strcmp(str, NJD_SET_UNVOICED_VOWEL_TOUTEN) == 0) {
      *mora = NJD_SET_UNVOICED_VOWEL_TOUTEN;
      *flag = 0;
      *size = strlen(NJD_SET_UNVOICED_VOWEL_TOUTEN);
      return;
   }
   if (strcmp(str, NJD_SET_UNVOICED_VOWEL_QUESTION) == 0) {
      *mora = NJD_SET_UNVOICED_VOWEL_QUESTION;
      *flag = 0;
      *size = strlen(NJD_SET_UNVOICED_VOWEL_QUESTION);
      return;
   }

   /* reset */
   *mora = NULL;
   *flag = -1;
   *size = 0;

   /* get mora */
   for (i = 0; njd_set_unvoiced_vowel_mora_list[i] != NULL; i++) {
      matched_size = strtopcmp(&str[index], njd_set_unvoiced_vowel_mora_list[i]);
      if (matched_size > 0) {
         *mora = njd_set_unvoiced_vowel_mora_list[i];
         *size = matched_size;
         break;
      }
   }

   /* get unvoice flag */
   matched_size = strtopcmp(&str[index + (*size)], NJD_SET_UNVOICED_VOWEL_QUOTATION);
   if (matched_size > 0) {
      *flag = 1;
      *size += matched_size;
   }
}